

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O3

void RangeEnc_Encode(CPpmd7z_RangeEnc *p,UInt32 start,UInt32 size,UInt32 total)

{
  uint uVar1;
  
  uVar1 = p->Range / total;
  p->Low = p->Low + (ulong)(start * uVar1);
  uVar1 = size * uVar1;
  p->Range = uVar1;
  while (uVar1 < 0x1000000) {
    p->Range = uVar1 << 8;
    RangeEnc_ShiftLow(p);
    uVar1 = p->Range;
  }
  return;
}

Assistant:

static void RangeEnc_Encode(CPpmd7z_RangeEnc *p, UInt32 start, UInt32 size, UInt32 total)
{
  p->Low += start * (p->Range /= total);
  p->Range *= size;
  while (p->Range < kTopValue)
  {
    p->Range <<= 8;
    RangeEnc_ShiftLow(p);
  }
}